

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_gcc.cc
# Opt level: O0

void UYVYToYRow_SSE2(uint8_t *src_uyvy,uint8_t *dst_y,int width)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  bool bVar3;
  int iVar4;
  ushort uVar5;
  ushort uVar6;
  ushort uVar7;
  ushort uVar8;
  ushort uVar9;
  ushort uVar10;
  ushort uVar11;
  ushort uVar12;
  ushort uVar13;
  ushort uVar14;
  ushort uVar15;
  ushort uVar16;
  ushort uVar17;
  ushort uVar18;
  ushort uVar19;
  ushort uVar20;
  int width_local;
  uint8_t *dst_y_local;
  uint8_t *src_uyvy_local;
  
  do {
    auVar1 = *(undefined1 (*) [16])src_uyvy;
    auVar2 = *(undefined1 (*) [16])((long)src_uyvy + 0x10);
    src_uyvy = (uint8_t *)((long)src_uyvy + 0x20);
    uVar5 = auVar1._0_2_ >> 8;
    uVar6 = auVar1._2_2_ >> 8;
    uVar7 = auVar1._4_2_ >> 8;
    uVar8 = auVar1._6_2_ >> 8;
    uVar9 = auVar1._8_2_ >> 8;
    uVar10 = auVar1._10_2_ >> 8;
    uVar11 = auVar1._12_2_ >> 8;
    uVar12 = auVar1._14_2_ >> 8;
    uVar13 = auVar2._0_2_ >> 8;
    uVar14 = auVar2._2_2_ >> 8;
    uVar15 = auVar2._4_2_ >> 8;
    uVar16 = auVar2._6_2_ >> 8;
    uVar17 = auVar2._8_2_ >> 8;
    uVar18 = auVar2._10_2_ >> 8;
    uVar19 = auVar2._12_2_ >> 8;
    uVar20 = auVar2._14_2_ >> 8;
    *dst_y = (uVar5 != 0) * (uVar5 < 0x100) * auVar1[1] - (0xff < uVar5);
    dst_y[1] = (uVar6 != 0) * (uVar6 < 0x100) * auVar1[3] - (0xff < uVar6);
    dst_y[2] = (uVar7 != 0) * (uVar7 < 0x100) * auVar1[5] - (0xff < uVar7);
    dst_y[3] = (uVar8 != 0) * (uVar8 < 0x100) * auVar1[7] - (0xff < uVar8);
    dst_y[4] = (uVar9 != 0) * (uVar9 < 0x100) * auVar1[9] - (0xff < uVar9);
    dst_y[5] = (uVar10 != 0) * (uVar10 < 0x100) * auVar1[0xb] - (0xff < uVar10);
    dst_y[6] = (uVar11 != 0) * (uVar11 < 0x100) * auVar1[0xd] - (0xff < uVar11);
    dst_y[7] = (uVar12 != 0) * (uVar12 < 0x100) * auVar1[0xf] - (0xff < uVar12);
    dst_y[8] = (uVar13 != 0) * (uVar13 < 0x100) * auVar2[1] - (0xff < uVar13);
    dst_y[9] = (uVar14 != 0) * (uVar14 < 0x100) * auVar2[3] - (0xff < uVar14);
    dst_y[10] = (uVar15 != 0) * (uVar15 < 0x100) * auVar2[5] - (0xff < uVar15);
    dst_y[0xb] = (uVar16 != 0) * (uVar16 < 0x100) * auVar2[7] - (0xff < uVar16);
    dst_y[0xc] = (uVar17 != 0) * (uVar17 < 0x100) * auVar2[9] - (0xff < uVar17);
    dst_y[0xd] = (uVar18 != 0) * (uVar18 < 0x100) * auVar2[0xb] - (0xff < uVar18);
    dst_y[0xe] = (uVar19 != 0) * (uVar19 < 0x100) * auVar2[0xd] - (0xff < uVar19);
    dst_y[0xf] = (uVar20 != 0) * (uVar20 < 0x100) * auVar2[0xf] - (0xff < uVar20);
    dst_y = dst_y + 0x10;
    iVar4 = width + -0x10;
    bVar3 = 0xf < width;
    width = iVar4;
  } while (iVar4 != 0 && bVar3);
  return;
}

Assistant:

void UYVYToYRow_SSE2(const uint8_t* src_uyvy, uint8_t* dst_y, int width) {
  asm volatile(

      LABELALIGN
      "1:                                        \n"
      "movdqu      (%0),%%xmm0                   \n"
      "movdqu      0x10(%0),%%xmm1               \n"
      "lea         0x20(%0),%0                   \n"
      "psrlw       $0x8,%%xmm0                   \n"
      "psrlw       $0x8,%%xmm1                   \n"
      "packuswb    %%xmm1,%%xmm0                 \n"
      "movdqu      %%xmm0,(%1)                   \n"
      "lea         0x10(%1),%1                   \n"
      "sub         $0x10,%2                      \n"
      "jg          1b                            \n"
      : "+r"(src_uyvy),  // %0
        "+r"(dst_y),     // %1
        "+r"(width)      // %2
      :
      : "memory", "cc", "xmm0", "xmm1");
}